

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

string * green_text(string *text)

{
  string local_38 [40];
  string *text_local;
  
  text_local = text;
  std::operator+((char *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "\x1b[38;5;10m");
  std::operator+(text,(char *)local_38);
  std::__cxx11::string::~string(local_38);
  return text;
}

Assistant:

string green_text(string text){return "\033[38;5;10m" + text + "\033[37m";}